

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O0

bool Imf_3_3::(anonymous_namespace)::runChecks<char_const*>
               (char **source,bool reduceMemory,bool reduceTime)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  __type _Var5;
  int iVar6;
  Header *pHVar7;
  string *psVar8;
  TileDescription *pTVar9;
  size_t sVar10;
  byte in_DL;
  byte in_SIL;
  undefined8 *in_RDI;
  bool in_stack_00000066;
  bool in_stack_00000067;
  DeepScanLineInputFile *in_stack_00000068;
  bool in_stack_00000096;
  bool in_stack_00000097;
  DeepTiledInputFile *in_stack_00000098;
  DeepTiledInputFile rgba_4;
  bool gotThrow_4;
  DeepScanLineInputFile rgba_3;
  bool gotThrow_3;
  TiledInputFile rgba_2;
  bool gotThrow_2;
  InputFile rgba_1;
  bool gotThrow_1;
  RgbaInputFile rgba;
  bool gotThrow;
  int bytesPerPixel;
  uint64_t tileSize;
  TileDescription *tileDescription;
  MultiPartInputFile multi;
  bool threw;
  bool largeTiles;
  string firstPartType;
  int maxTileHeight;
  int maxTileWidth;
  int maxImageHeight;
  int maxImageWidth;
  uint64_t oldMaxSampleCount;
  undefined4 in_stack_fffffffffffffde8;
  undefined2 in_stack_fffffffffffffdec;
  undefined1 in_stack_fffffffffffffdee;
  undefined1 in_stack_fffffffffffffdef;
  RgbaInputFile *in_stack_fffffffffffffdf0;
  DeepTiledInputFile *this;
  RgbaInputFile *in_stack_fffffffffffffe00;
  int in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  undefined8 in_stack_fffffffffffffe70;
  char *fileName;
  undefined4 in_stack_fffffffffffffe80;
  undefined2 uVar11;
  undefined1 reduceTime_00;
  undefined1 reduceMemory_00;
  RgbaInputFile *in_stack_fffffffffffffe88;
  bool local_4a;
  string local_48 [32];
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int64_t local_18;
  byte local_a;
  byte local_9;
  undefined8 *local_8;
  
  local_9 = in_SIL & 1;
  local_a = in_DL & 1;
  local_8 = in_RDI;
  local_18 = CompositeDeepScanLine::getMaximumSampleCount();
  Header::getMaxImageSize(&local_1c,&local_20);
  Header::getMaxImageSize(&local_24,&local_28);
  if (((local_9 & 1) != 0) || ((local_a & 1) != 0)) {
    CompositeDeepScanLine::setMaximumSampleCount(0x100000);
    Header::setMaxImageSize(0x800,0x800);
    Header::setMaxTileSize(0x200,0x200);
  }
  std::__cxx11::string::string(local_48);
  fileName = (char *)*local_8;
  iVar6 = globalThreadCount();
  uVar11 = (undefined2)iVar6;
  reduceTime_00 = (undefined1)((uint)iVar6 >> 0x10);
  reduceMemory_00 = (undefined1)((uint)iVar6 >> 0x18);
  MultiPartInputFile::MultiPartInputFile
            ((MultiPartInputFile *)
             CONCAT17(reduceMemory_00,
                      CONCAT16(reduceTime_00,CONCAT24(uVar11,in_stack_fffffffffffffe80))),fileName,
             (int)((ulong)in_stack_fffffffffffffe70 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffe70 >> 0x18,0));
  pHVar7 = MultiPartInputFile::header
                     ((MultiPartInputFile *)in_stack_fffffffffffffdf0,
                      CONCAT13(in_stack_fffffffffffffdef,
                               CONCAT12(in_stack_fffffffffffffdee,in_stack_fffffffffffffdec)));
  iVar6 = (int)((ulong)pHVar7 >> 0x20);
  psVar8 = Header::type_abi_cxx11_((Header *)0x1659eb);
  std::__cxx11::string::operator=(local_48,(string *)psVar8);
  bVar3 = isTiled((string *)in_stack_fffffffffffffdf0);
  if (bVar3) {
    MultiPartInputFile::header
              ((MultiPartInputFile *)in_stack_fffffffffffffdf0,
               CONCAT13(in_stack_fffffffffffffdef,
                        CONCAT12(in_stack_fffffffffffffdee,in_stack_fffffffffffffdec)));
    pTVar9 = Header::tileDescription((Header *)0x165a4c);
    uVar1 = pTVar9->xSize;
    uVar2 = pTVar9->ySize;
    MultiPartInputFile::header
              ((MultiPartInputFile *)in_stack_fffffffffffffdf0,
               CONCAT13(in_stack_fffffffffffffdef,
                        CONCAT12(in_stack_fffffffffffffdee,in_stack_fffffffffffffdec)));
    sVar10 = calculateBytesPerPixel((Header *)in_stack_fffffffffffffe00);
    bVar3 = 1000000 < (ulong)uVar1 * (ulong)uVar2 * (long)(int)sVar10;
  }
  else {
    bVar3 = false;
  }
  local_4a = anon_unknown_0::readMultiPart
                       ((MultiPartInputFile *)
                        CONCAT17(reduceMemory_00,
                                 CONCAT16(reduceTime_00,CONCAT24(uVar11,in_stack_fffffffffffffe80)))
                        ,SUB81((ulong)fileName >> 0x38,0),SUB81((ulong)fileName >> 0x30,0));
  MultiPartInputFile::~MultiPartInputFile((MultiPartInputFile *)in_stack_fffffffffffffdf0);
  if ((local_9 & 1) == 0) {
    anon_unknown_0::resetInput((char *)*local_8);
    globalThreadCount();
    RgbaInputFile::RgbaInputFile
              (in_stack_fffffffffffffdf0,
               (char *)CONCAT17(in_stack_fffffffffffffdef,
                                CONCAT16(in_stack_fffffffffffffdee,
                                         CONCAT24(in_stack_fffffffffffffdec,
                                                  in_stack_fffffffffffffde8))),0);
    bVar4 = anon_unknown_0::readRgba
                      (in_stack_fffffffffffffe88,(bool)reduceMemory_00,(bool)reduceTime_00);
    RgbaInputFile::~RgbaInputFile(in_stack_fffffffffffffe00);
    if ((bVar4) &&
       (bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffdf0,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffffdef,
                                          CONCAT16(in_stack_fffffffffffffdee,
                                                   CONCAT24(in_stack_fffffffffffffdec,
                                                            in_stack_fffffffffffffde8)))), bVar4)) {
      local_4a = true;
    }
    anon_unknown_0::resetInput((char *)*local_8);
    globalThreadCount();
    InputFile::InputFile
              ((InputFile *)
               CONCAT17(reduceMemory_00,
                        CONCAT16(reduceTime_00,CONCAT24(uVar11,in_stack_fffffffffffffe80))),fileName
               ,iVar6);
    bVar4 = anon_unknown_0::readScanline<Imf_3_3::InputFile>
                      ((InputFile *)
                       rgba_3._data.
                       super___shared_ptr<Imf_3_3::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,rgba_3._ctxt._ctxt.
                               super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi._7_1_,
                       rgba_3._ctxt._ctxt.
                       super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi._6_1_);
    InputFile::~InputFile((InputFile *)in_stack_fffffffffffffdf0);
    if ((bVar4) &&
       (bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffdf0,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffffdef,
                                          CONCAT16(in_stack_fffffffffffffdee,
                                                   CONCAT24(in_stack_fffffffffffffdec,
                                                            in_stack_fffffffffffffde8)))), bVar4)) {
      local_4a = true;
    }
  }
  if (((local_9 & 1) == 0) || (!bVar3)) {
    anon_unknown_0::resetInput((char *)*local_8);
    in_stack_fffffffffffffe10 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*local_8;
    globalThreadCount();
    TiledInputFile::TiledInputFile
              ((TiledInputFile *)
               CONCAT17(reduceMemory_00,
                        CONCAT16(reduceTime_00,CONCAT24(uVar11,in_stack_fffffffffffffe80))),fileName
               ,iVar6);
    bVar4 = anon_unknown_0::readTile<Imf_3_3::TiledInputFile>
                      ((TiledInputFile *)
                       rgba_3._data.
                       super___shared_ptr<Imf_3_3::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,rgba_3._ctxt._ctxt.
                               super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi._7_1_,
                       rgba_3._ctxt._ctxt.
                       super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi._6_1_);
    in_stack_fffffffffffffe0c = CONCAT13(bVar4,(int3)in_stack_fffffffffffffe0c);
    TiledInputFile::~TiledInputFile((TiledInputFile *)in_stack_fffffffffffffdf0);
    if ((bVar4) &&
       (_Var5 = std::operator==(in_stack_fffffffffffffe10,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08)),
       _Var5)) {
      local_4a = true;
    }
  }
  if ((local_9 & 1) == 0) {
    anon_unknown_0::resetInput((char *)*local_8);
    in_stack_fffffffffffffe08 = globalThreadCount();
    DeepScanLineInputFile::DeepScanLineInputFile
              ((DeepScanLineInputFile *)
               CONCAT17(reduceMemory_00,
                        CONCAT16(reduceTime_00,CONCAT24(uVar11,in_stack_fffffffffffffe80))),fileName
               ,iVar6);
    bVar4 = anon_unknown_0::readDeepScanLine<Imf_3_3::DeepScanLineInputFile>
                      (in_stack_00000068,in_stack_00000067,in_stack_00000066);
    DeepScanLineInputFile::~DeepScanLineInputFile
              ((DeepScanLineInputFile *)in_stack_fffffffffffffdf0);
    if ((bVar4) &&
       (_Var5 = std::operator==(in_stack_fffffffffffffe10,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08)),
       _Var5)) {
      local_4a = true;
    }
  }
  if (((local_9 & 1) == 0) || (!bVar3)) {
    anon_unknown_0::resetInput((char *)*local_8);
    this = (DeepTiledInputFile *)*local_8;
    globalThreadCount();
    DeepTiledInputFile::DeepTiledInputFile
              ((DeepTiledInputFile *)
               CONCAT17(reduceMemory_00,
                        CONCAT16(reduceTime_00,CONCAT24(uVar11,in_stack_fffffffffffffe80))),fileName
               ,iVar6);
    bVar3 = anon_unknown_0::readDeepTile<Imf_3_3::DeepTiledInputFile>
                      (in_stack_00000098,in_stack_00000097,in_stack_00000096);
    DeepTiledInputFile::~DeepTiledInputFile(this);
    if ((bVar3) &&
       (_Var5 = std::operator==(in_stack_fffffffffffffe10,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08)),
       _Var5)) {
      local_4a = true;
    }
  }
  CompositeDeepScanLine::setMaximumSampleCount(local_18);
  Header::setMaxImageSize(local_1c,local_20);
  Header::setMaxTileSize(local_24,local_28);
  std::__cxx11::string::~string(local_48);
  return (bool)(local_4a & 1);
}

Assistant:

bool
runChecks (T& source, bool reduceMemory, bool reduceTime)
{

    //
    // in reduceMemory/reduceTime mode, limit image size, tile size, and maximum deep samples
    //

    uint64_t oldMaxSampleCount =
        CompositeDeepScanLine::getMaximumSampleCount ();

    int maxImageWidth, maxImageHeight;
    Header::getMaxImageSize (maxImageWidth, maxImageHeight);

    int maxTileWidth, maxTileHeight;
    Header::getMaxImageSize (maxTileWidth, maxTileHeight);

    if (reduceMemory || reduceTime)
    {
        CompositeDeepScanLine::setMaximumSampleCount (1 << 20);
        Header::setMaxImageSize (2048, 2048);
        Header::setMaxTileSize (512, 512);
    }

    //
    // multipart test: also grab the type of the first part to
    // check which other tests are expected to fail
    // check the image width for the first part - significant memory
    // is required to process wide parts
    //

    string firstPartType;

    //
    // scanline images with very wide parts and tiled images with large tiles
    // take excessive memory to read.
    // Assume the first part requires excessive memory until the header of the first part is checked
    // so the single part input APIs can be skipped.
    //
    // If the MultiPartInputFile constructor throws an exception, the first part
    // will assumed to be a wide image
    //
    bool largeTiles = true;

    bool threw = false;
    {
        try
        {
            MultiPartInputFile multi (source);

            //
            // significant memory is also required to read a tiled file
            // using the scanline interface with tall tiles - the scanlineAPI
            // needs to allocate memory to store an entire row of tiles
            //

            firstPartType = multi.header (0).type ();
            if (isTiled (firstPartType))
            {
                const TileDescription& tileDescription =
                    multi.header (0).tileDescription ();
                uint64_t tileSize =
                    static_cast<uint64_t> (tileDescription.xSize) *
                    static_cast<uint64_t> (tileDescription.ySize);
                int bytesPerPixel = calculateBytesPerPixel (multi.header (0));

                if (tileSize * bytesPerPixel <= gMaxTileBytes)
                {
                    largeTiles = false;
                }
            }
            else
            {
                // file is not tiled, so can't contain large tiles
                // setting largeTiles false here causes the Tile and DeepTile API
                // tests to run on non-tiled files, which should cause exceptions to be thrown
                largeTiles = false;
            }

            threw = readMultiPart (multi, reduceMemory, reduceTime);
        }
        catch (...)
        {
            threw = true;
        }
    }

    // read using both scanline interfaces (unless the image is wide and reduce memory enabled)
    if (!reduceMemory)
    {
        {
            bool gotThrow = false;
            resetInput (source);
            try
            {
                RgbaInputFile rgba (source);
                gotThrow = readRgba (rgba, reduceMemory, reduceTime);
            }
            catch (...)
            {
                gotThrow = true;
            }
            if (gotThrow && firstPartType != DEEPTILE) { threw = true; }
        }
        {
            bool gotThrow = false;
            resetInput (source);
            try
            {
                InputFile rgba (source);
                gotThrow = readScanline (rgba, reduceMemory, reduceTime);
            }
            catch (...)
            {
                gotThrow = true;
            }
            if (gotThrow && firstPartType != DEEPTILE) { threw = true; }
        }
    }

    if (!reduceMemory || !largeTiles)
    {
        bool gotThrow = false;
        resetInput (source);
        try
        {
            TiledInputFile rgba (source);
            gotThrow = readTile (rgba, reduceMemory, reduceTime);
        }
        catch (...)
        {
            gotThrow = true;
        }
        if (gotThrow && firstPartType == TILEDIMAGE) { threw = true; }
    }

    if (!reduceMemory)
    {
        bool gotThrow = false;
        resetInput (source);
        try
        {
            DeepScanLineInputFile rgba (source);
            gotThrow = readDeepScanLine (rgba, reduceMemory, reduceTime);
        }
        catch (...)
        {
            gotThrow = true;
        }
        if (gotThrow && firstPartType == DEEPSCANLINE) { threw = true; }
    }

    if (!reduceMemory || !largeTiles)
    {
        bool gotThrow = false;
        resetInput (source);
        try
        {
            DeepTiledInputFile rgba (source);
            gotThrow = readDeepTile (rgba, reduceMemory, reduceTime);
        }
        catch (...)
        {
            gotThrow = true;
        }
        if (gotThrow && firstPartType == DEEPTILE) { threw = true; }
    }

    CompositeDeepScanLine::setMaximumSampleCount (oldMaxSampleCount);
    Header::setMaxImageSize (maxImageWidth, maxImageHeight);
    Header::setMaxTileSize (maxTileWidth, maxTileHeight);

    return threw;
}